

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkSweep(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_44;
  int nNodesOld;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x263,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkToBdd(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Converting to BDD has failed.\n");
    pNtk_local._4_4_ = 1;
  }
  else {
    iVar1 = Abc_NtkNodeNum(pNtk);
    Abc_NtkCleanup(pNtk,0);
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    p = Vec_PtrAlloc(100);
    for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar2; local_44 = local_44 + 1)
    {
      pAVar3 = Abc_NtkObj(pNtk,local_44);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 != 0)) &&
         (iVar2 = Abc_ObjFaninNum(pAVar3), iVar2 < 2)) {
        Vec_PtrPush(p,pAVar3);
      }
    }
    while (iVar2 = Vec_PtrSize(p), 0 < iVar2) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrPop(p);
      iVar2 = Abc_ObjIsNode(pAVar3);
      if ((iVar2 != 0) && (pAVar4 = Abc_NodeFindNonCoFanout(pAVar3), pAVar4 != (Abc_Obj_t *)0x0)) {
        iVar2 = Abc_ObjIsNode(pAVar4);
        if (iVar2 == 0) {
          __assert_fail("Abc_ObjIsNode(pFanout)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x280,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
        }
        iVar2 = Abc_ObjFaninNum(pAVar3);
        if (iVar2 == 0) {
          iVar2 = Abc_NodeIsConst0(pAVar3);
          Abc_NodeConstantInput(pAVar4,pAVar3,iVar2);
        }
        else {
          iVar2 = Abc_ObjFaninNum(pAVar3);
          if (iVar2 != 1) {
            __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                          ,0x286,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
          }
          pAVar5 = Abc_ObjFanin0(pAVar3);
          iVar2 = Abc_NodeIsInv(pAVar3);
          if (iVar2 != 0) {
            Abc_NodeComplementInput(pAVar4,pAVar3);
          }
          Abc_ObjPatchFanin(pAVar4,pAVar3,pAVar5);
        }
        Abc_NodeRemoveDupFanins(pAVar4);
        Abc_NodeMinimumBase(pAVar4);
        iVar2 = Abc_ObjFaninNum(pAVar4);
        if (iVar2 < 2) {
          Vec_PtrPush(p,pAVar4);
        }
        iVar2 = Abc_ObjFanoutNum(pAVar3);
        if (iVar2 < 1) {
          Abc_NtkDeleteObj_rec(pAVar3,1);
        }
        else {
          Vec_PtrPush(p,pAVar3);
        }
      }
    }
    Vec_PtrFree(p);
    for (local_44 = 0; iVar2 = Abc_NtkCoNum(pNtk), local_44 < iVar2; local_44 = local_44 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,local_44);
      pAVar4 = Abc_ObjFanin0(pAVar3);
      iVar2 = Abc_ObjFaninNum(pAVar4);
      if (iVar2 == 1) {
        pAVar5 = Abc_ObjFanin0(pAVar4);
        iVar2 = Abc_ObjFanoutNum(pAVar5);
        if ((iVar2 == 1) && (iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0)) {
          iVar2 = Abc_NodeIsInv(pAVar4);
          if (iVar2 != 0) {
            (pAVar5->field_5).pData = (void *)((ulong)(pAVar5->field_5).pData ^ 1);
          }
          Abc_ObjPatchFanin(pAVar3,pAVar4,pAVar5);
        }
      }
    }
    Abc_NtkCleanup(pNtk,0);
    if (fVerbose != 0) {
      iVar2 = Abc_NtkNodeNum(pNtk);
      printf("Sweep removed %d nodes.\n",(ulong)(uint)(iVar1 - iVar2));
    }
    iVar2 = Abc_NtkNodeNum(pNtk);
    pNtk_local._4_4_ = iVar1 - iVar2;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkSweep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanout, * pDriver;
    int i, nNodesOld;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 1;
    }
    // perform cleanup
    nNodesOld = Abc_NtkNodeNum(pNtk);
    Abc_NtkCleanup( pNtk, 0 );
    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    // collect sweepable nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( Abc_ObjFaninNum(pNode) < 2 )
            Vec_PtrPush( vNodes, pNode );
    // sweep the nodes
    while ( Vec_PtrSize(vNodes) > 0 )
    {
        // get any sweepable node
        pNode = (Abc_Obj_t *)Vec_PtrPop(vNodes);
        if ( !Abc_ObjIsNode(pNode) )
            continue;
        // get any non-CO fanout of this node
        pFanout = Abc_NodeFindNonCoFanout(pNode);
        if ( pFanout == NULL )
            continue;
        assert( Abc_ObjIsNode(pFanout) );
        // transform the function of the fanout
        if ( Abc_ObjFaninNum(pNode) == 0 )
            Abc_NodeConstantInput( pFanout, pNode, Abc_NodeIsConst0(pNode) );
        else 
        {
            assert( Abc_ObjFaninNum(pNode) == 1 );
            pDriver = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsInv(pNode) )
                Abc_NodeComplementInput( pFanout, pNode );
            Abc_ObjPatchFanin( pFanout, pNode, pDriver );
        }
        Abc_NodeRemoveDupFanins( pFanout );
        Abc_NodeMinimumBase( pFanout );
        // check if the fanout should be added
        if ( Abc_ObjFaninNum(pFanout) < 2 )
            Vec_PtrPush( vNodes, pFanout );
        // check if the node has other fanouts
        if ( Abc_ObjFanoutNum(pNode) > 0 )
            Vec_PtrPush( vNodes, pNode );
        else
            Abc_NtkDeleteObj_rec( pNode, 1 );
    }
    Vec_PtrFree( vNodes );
    // sweep a node into its CO fanout if all of this is true:
    // (a) this node is a single-input node
    // (b) the driver of the node has only one fanout (this node)
    // (c) the driver is a node
    Abc_NtkForEachCo( pNtk, pFanout, i )
    {
        pNode = Abc_ObjFanin0(pFanout);
        if ( Abc_ObjFaninNum(pNode) != 1 )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( !(Abc_ObjFanoutNum(pDriver) == 1 && Abc_ObjIsNode(pDriver)) )
            continue;
        // trasform this CO
        if ( Abc_NodeIsInv(pNode) )
            pDriver->pData = Cudd_Not(pDriver->pData);
        Abc_ObjPatchFanin( pFanout, pNode, pDriver );
    }
    // perform cleanup
    Abc_NtkCleanup( pNtk, 0 );
    // report
    if ( fVerbose )
        printf( "Sweep removed %d nodes.\n", nNodesOld - Abc_NtkNodeNum(pNtk) );
    return nNodesOld - Abc_NtkNodeNum(pNtk);
}